

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O2

void net_select_result(int fd,int event)

{
  size_t sVar1;
  SockAddr *pSVar2;
  addrinfo *paVar3;
  undefined8 uVar4;
  _Bool _Var5;
  int iVar6;
  int iVar7;
  NetSocket *s;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  ssize_t sVar11;
  PlugVtable *pPVar12;
  int *piVar13;
  SockAddrStep *pSVar14;
  size_t __n;
  char *pcVar15;
  PlugCloseType PVar16;
  Plug *pPVar17;
  size_t sVar18;
  int err;
  int fd_local;
  socklen_t errlen;
  char buf [20480];
  
  fd_local = fd;
  s = (NetSocket *)find234(sktree,&fd_local,cmpforsearch);
  if (s == (NetSocket *)0x0) {
    return;
  }
  noise_ultralight(NOISE_SOURCE_IOID,(long)fd_local);
  if (event == 1) {
    if (s->listener == true) {
      err = 0x80;
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = '\0';
      buf[3] = '\0';
      buf[4] = '\0';
      buf[5] = '\0';
      buf[6] = '\0';
      buf[7] = '\0';
      buf[8] = '\0';
      buf[9] = '\0';
      buf[10] = '\0';
      buf[0xb] = '\0';
      buf[0xc] = '\0';
      buf[0xd] = '\0';
      buf[0xe] = '\0';
      buf[0xf] = '\0';
      buf[0x10] = '\0';
      buf[0x11] = '\0';
      buf[0x12] = '\0';
      buf[0x13] = '\0';
      buf[0x14] = '\0';
      buf[0x15] = '\0';
      buf[0x16] = '\0';
      buf[0x17] = '\0';
      buf[0x18] = '\0';
      buf[0x19] = '\0';
      buf[0x1a] = '\0';
      buf[0x1b] = '\0';
      buf[0x1c] = '\0';
      buf[0x1d] = '\0';
      buf[0x1e] = '\0';
      buf[0x1f] = '\0';
      buf[0x20] = '\0';
      buf[0x21] = '\0';
      buf[0x22] = '\0';
      buf[0x23] = '\0';
      buf[0x24] = '\0';
      buf[0x25] = '\0';
      buf[0x26] = '\0';
      buf[0x27] = '\0';
      buf[0x28] = '\0';
      buf[0x29] = '\0';
      buf[0x2a] = '\0';
      buf[0x2b] = '\0';
      buf[0x2c] = '\0';
      buf[0x2d] = '\0';
      buf[0x2e] = '\0';
      buf[0x2f] = '\0';
      buf[0x30] = '\0';
      buf[0x31] = '\0';
      buf[0x32] = '\0';
      buf[0x33] = '\0';
      buf[0x34] = '\0';
      buf[0x35] = '\0';
      buf[0x36] = '\0';
      buf[0x37] = '\0';
      buf[0x38] = '\0';
      buf[0x39] = '\0';
      buf[0x3a] = '\0';
      buf[0x3b] = '\0';
      buf[0x3c] = '\0';
      buf[0x3d] = '\0';
      buf[0x3e] = '\0';
      buf[0x3f] = '\0';
      buf[0x40] = '\0';
      buf[0x41] = '\0';
      buf[0x42] = '\0';
      buf[0x43] = '\0';
      buf[0x44] = '\0';
      buf[0x45] = '\0';
      buf[0x46] = '\0';
      buf[0x47] = '\0';
      buf[0x48] = '\0';
      buf[0x49] = '\0';
      buf[0x4a] = '\0';
      buf[0x4b] = '\0';
      buf[0x4c] = '\0';
      buf[0x4d] = '\0';
      buf[0x4e] = '\0';
      buf[0x4f] = '\0';
      buf[0x50] = '\0';
      buf[0x51] = '\0';
      buf[0x52] = '\0';
      buf[0x53] = '\0';
      buf[0x54] = '\0';
      buf[0x55] = '\0';
      buf[0x56] = '\0';
      buf[0x57] = '\0';
      buf[0x58] = '\0';
      buf[0x59] = '\0';
      buf[0x5a] = '\0';
      buf[0x5b] = '\0';
      buf[0x5c] = '\0';
      buf[0x5d] = '\0';
      buf[0x5e] = '\0';
      buf[0x5f] = '\0';
      buf[0x60] = '\0';
      buf[0x61] = '\0';
      buf[0x62] = '\0';
      buf[99] = '\0';
      buf[100] = '\0';
      buf[0x65] = '\0';
      buf[0x66] = '\0';
      buf[0x67] = '\0';
      buf[0x68] = '\0';
      buf[0x69] = '\0';
      buf[0x6a] = '\0';
      buf[0x6b] = '\0';
      buf[0x6c] = '\0';
      buf[0x6d] = '\0';
      buf[0x6e] = '\0';
      buf[0x6f] = '\0';
      buf[0x70] = '\0';
      buf[0x71] = '\0';
      buf[0x72] = '\0';
      buf[0x73] = '\0';
      buf[0x74] = '\0';
      buf[0x75] = '\0';
      buf[0x76] = '\0';
      buf[0x77] = '\0';
      buf[0x78] = '\0';
      buf[0x79] = '\0';
      buf[0x7a] = '\0';
      buf[0x7b] = '\0';
      buf[0x7c] = '\0';
      buf[0x7d] = '\0';
      buf[0x7e] = '\0';
      buf[0x7f] = '\0';
      iVar7 = accept(s->s,(sockaddr *)buf,(socklen_t *)&err);
      if (iVar7 < 0) {
        return;
      }
      nonblock(iVar7);
      if (((((s->addr != (SockAddr *)0x0) && (s->addr->superfamily == UNIX)) ||
           (s->localhost_only != true)) || (_Var5 = sockaddr_is_loopback((sockaddr *)buf), _Var5))
         && (iVar6 = (*s->plug->vt->accepting)(s->plug,sk_net_accept,SUB48(iVar7,0)), iVar6 == 0)) {
        return;
      }
      close(iVar7);
      return;
    }
    if (s->frozen != false) {
      return;
    }
    iVar7 = 0;
    if ((s->oobinline == true) && (s->oobpending == true)) {
      iVar7 = ioctl(s->s,0x8905,buf);
      if (iVar7 == 0) {
        iVar7 = 1;
        if (buf._0_4_ == 0) goto LAB_001449ad;
        s->oobpending = false;
      }
      iVar7 = 0;
    }
LAB_001449ad:
    __n = 0x5000;
    if (s->oobpending != false) {
      __n = 1;
    }
    sVar11 = recv(s->s,buf,__n,0);
    iVar6 = (int)sVar11;
    sVar18 = (size_t)iVar6;
    noise_ultralight(NOISE_SOURCE_IOLEN,sVar18);
    if (-1 < iVar6) {
      if (iVar6 != 0) {
        if (s->addr != (SockAddr *)0x0) {
          sk_addr_free(s->addr);
          s->addr = (SockAddr *)0x0;
        }
        pPVar17 = s->plug;
        pPVar12 = pPVar17->vt;
LAB_00144a60:
        (*pPVar12->receive)(pPVar17,iVar7,buf,sVar18);
        return;
      }
      s->incomingeof = true;
      uxsel_tell(s);
      pPVar17 = s->plug;
      pPVar12 = pPVar17->vt;
      PVar16 = PLUGCLOSE_NORMAL;
      pcVar15 = (char *)0x0;
LAB_00144c19:
      (*pPVar12->closing)(pPVar17,PVar16,pcVar15);
      return;
    }
    piVar13 = __errno_location();
    iVar7 = *piVar13;
    if (iVar7 == 0xb) {
      return;
    }
    pPVar17 = s->plug;
LAB_00144bf3:
    plug_closing_errno(pPVar17,iVar7);
    return;
  }
  if (event != 2) {
    if (event != 4) {
      return;
    }
    if (s->oobinline != false) {
      s->oobpending = true;
      return;
    }
    sVar11 = recv(s->s,buf,0x5000,1);
    iVar7 = (int)sVar11;
    sVar18 = (size_t)iVar7;
    noise_ultralight(NOISE_SOURCE_IOLEN,sVar18);
    if (iVar7 == 0) {
      pPVar17 = s->plug;
      pPVar12 = pPVar17->vt;
      pcVar15 = "Internal networking trouble";
      PVar16 = PLUGCLOSE_ERROR;
      goto LAB_00144c19;
    }
    if (-1 < iVar7) {
      if (s->addr != (SockAddr *)0x0) {
        sk_addr_free(s->addr);
        s->addr = (SockAddr *)0x0;
      }
      pPVar17 = s->plug;
      pPVar12 = pPVar17->vt;
      iVar7 = 2;
      goto LAB_00144a60;
    }
    pPVar17 = s->plug;
    piVar13 = __errno_location();
    iVar7 = *piVar13;
    goto LAB_00144bf3;
  }
  if (s->connected != false) {
    s->writable = true;
    sVar18 = s->sending_oob;
    sVar8 = bufchain_size(&s->output_data);
    try_send(s);
    sVar1 = s->sending_oob;
    sVar9 = bufchain_size(&s->output_data);
    uVar10 = sVar9 + sVar1;
    if (sVar8 + sVar18 <= uVar10) {
      return;
    }
    (*s->plug->vt->sent)(s->plug,uVar10);
    return;
  }
  errlen = 4;
  iVar7 = getsockopt(s->s,1,4,&err,&errlen);
  if (iVar7 < 0) {
    piVar13 = __errno_location();
    pcVar15 = strerror(*piVar13);
    pcVar15 = dupprintf("getsockopt(SO_ERROR): %s",pcVar15);
    err = *piVar13;
LAB_00144a95:
    if (pcVar15 != (char *)0x0) {
      pSVar2 = s->addr;
      if (pSVar2 == (SockAddr *)0x0) {
        __assert_fail("s->addr",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/network.c"
                      ,0x591,"void net_select_result(int, int)");
      }
      pSVar14 = (SockAddrStep *)&pSVar2->ais;
      if (pSVar2->superfamily == IP) {
        pSVar14 = &s->step;
      }
      buf._24_8_ = pSVar14->ai;
      buf[0] = '\x01';
      buf[1] = '\0';
      buf[2] = '\0';
      buf[3] = '\0';
      uVar4 = *(undefined8 *)((long)&pSVar2->error + 4);
      buf[0x14] = pSVar2->field_0x14;
      buf[0x15] = pSVar2->field_0x15;
      buf[0x16] = pSVar2->field_0x16;
      buf[0x17] = pSVar2->field_0x17;
      buf._4_4_ = (undefined4)*(undefined8 *)&pSVar2->field_0x4;
      buf._8_4_ = (undefined4)((ulong)*(undefined8 *)&pSVar2->field_0x4 >> 0x20);
      buf._12_4_ = (undefined4)uVar4;
      buf._16_4_ = (undefined4)((ulong)uVar4 >> 0x20);
      memmove(buf + 0x20,pSVar2->hostname,0x200);
      (*s->plug->vt->log)(s->plug,PLUGLOG_CONNECT_FAILED,(SockAddr *)buf,s->port,pcVar15,err);
      while (err != 0) {
        if (((s->addr == (SockAddr *)0x0) || (paVar3 = (s->step).ai, paVar3 == (addrinfo *)0x0)) ||
           (paVar3 = paVar3->ai_next, paVar3 == (addrinfo *)0x0)) {
          pPVar17 = s->plug;
          iVar7 = err;
          goto LAB_00144bf3;
        }
        (s->step).ai = paVar3;
        err = try_connect(s);
      }
      if (s->connected == false) {
        return;
      }
      goto LAB_00144b95;
    }
  }
  else if (err != 0) {
    pcVar15 = strerror(err);
    pcVar15 = dupstr(pcVar15);
    goto LAB_00144a95;
  }
  pSVar2 = s->addr;
  memcpy(buf,pSVar2,0x220);
  buf[0] = '\x01';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  if (pSVar2->superfamily == IP) {
    buf._24_8_ = (s->step).ai;
  }
  (*s->plug->vt->log)(s->plug,PLUGLOG_CONNECT_SUCCESS,(SockAddr *)buf,s->port,(char *)0x0,0);
LAB_00144b95:
  if (s->addr != (SockAddr *)0x0) {
    sk_addr_free(s->addr);
    s->addr = (SockAddr *)0x0;
  }
  s->connected = true;
  s->writable = true;
  uxsel_tell(s);
  return;
}

Assistant:

static void net_select_result(int fd, int event)
{
    int ret;
    char buf[20480];                   /* nice big buffer for plenty of speed */
    NetSocket *s;
    bool atmark = true;

    /* Find the Socket structure */
    s = find234(sktree, &fd, cmpforsearch);
    if (!s)
        return;                /* boggle */

    noise_ultralight(NOISE_SOURCE_IOID, fd);

    switch (event) {
      case SELECT_X:                   /* exceptional */
        if (!s->oobinline) {
            /*
             * On a non-oobinline socket, this indicates that we
             * can immediately perform an OOB read and get back OOB
             * data, which we will send to the back end with
             * type==2 (urgent data).
             */
            ret = recv(s->s, buf, sizeof(buf), MSG_OOB);
            noise_ultralight(NOISE_SOURCE_IOLEN, ret);
            if (ret == 0) {
                plug_closing_error(s->plug, "Internal networking trouble");
            } else if (ret < 0) {
                plug_closing_errno(s->plug, errno);
            } else {
                /*
                 * Receiving actual data on a socket means we can
                 * stop falling back through the candidate
                 * addresses to connect to.
                 */
                if (s->addr) {
                    sk_addr_free(s->addr);
                    s->addr = NULL;
                }
                plug_receive(s->plug, 2, buf, ret);
            }
            break;
        }

        /*
         * If we reach here, this is an oobinline socket, which
         * means we should set s->oobpending and then deal with it
         * when we get called for the readability event (which
         * should also occur).
         */
        s->oobpending = true;
        break;
      case SELECT_R:                   /* readable; also acceptance */
        if (s->listener) {
            /*
             * On a listening socket, the readability event means a
             * connection is ready to be accepted.
             */
            union sockaddr_union su;
            socklen_t addrlen = sizeof(su);
            accept_ctx_t actx;
            int t;  /* socket of connection */

            memset(&su, 0, addrlen);
            t = accept(s->s, &su.sa, &addrlen);
            if (t < 0) {
                break;
            }

            nonblock(t);
            actx.i = t;

            if ((!s->addr || s->addr->superfamily != UNIX) &&
                s->localhost_only && !sockaddr_is_loopback(&su.sa)) {
                close(t);              /* someone let nonlocal through?! */
            } else if (plug_accepting(s->plug, sk_net_accept, actx)) {
                close(t);              /* denied or error */
            }
            break;
        }

        /*
         * If we reach here, this is not a listening socket, so
         * readability really means readability.
         */

        /* In the case the socket is still frozen, we don't even bother */
        if (s->frozen)
            break;

        /*
         * We have received data on the socket. For an oobinline
         * socket, this might be data _before_ an urgent pointer,
         * in which case we send it to the back end with type==1
         * (data prior to urgent).
         */
        if (s->oobinline && s->oobpending) {
            int atmark_from_ioctl;
            if (ioctl(s->s, SIOCATMARK, &atmark_from_ioctl) == 0) {
                atmark = atmark_from_ioctl;
                if (atmark)
                    s->oobpending = false; /* clear this indicator */
            }
        } else
            atmark = true;

        ret = recv(s->s, buf, s->oobpending ? 1 : sizeof(buf), 0);
        noise_ultralight(NOISE_SOURCE_IOLEN, ret);
        if (ret < 0) {
            if (errno == EWOULDBLOCK) {
                break;
            }
        }
        if (ret < 0) {
            plug_closing_errno(s->plug, errno);
        } else if (0 == ret) {
            s->incomingeof = true;     /* stop trying to read now */
            uxsel_tell(s);
            plug_closing_normal(s->plug);
        } else {
            /*
             * Receiving actual data on a socket means we can
             * stop falling back through the candidate
             * addresses to connect to.
             */
            if (s->addr) {
                sk_addr_free(s->addr);
                s->addr = NULL;
            }
            plug_receive(s->plug, atmark ? 0 : 1, buf, ret);
        }
        break;
      case SELECT_W:                   /* writable */
        if (!s->connected) {
            /*
             * select/poll reports a socket as _writable_ when an
             * asynchronous connect() attempt either completes or
             * fails. So first we must find out which.
             */
            {
                int err;
                socklen_t errlen = sizeof(err);
                char *errmsg = NULL;
                if (getsockopt(s->s, SOL_SOCKET, SO_ERROR, &err, &errlen)<0) {
                    errmsg = dupprintf("getsockopt(SO_ERROR): %s",
                                       strerror(errno));
                    err = errno;       /* got to put something in here */
                } else if (err != 0) {
                    errmsg = dupstr(strerror(err));
                }
                if (errmsg) {
                    /*
                     * The asynchronous connection attempt failed.
                     * Report the problem via plug_log, and try again
                     * with the next candidate address, if we have
                     * more than one.
                     */
                    SockAddr thisaddr;
                    assert(s->addr);

                    thisaddr = sk_extractaddr_tmp(s->addr, &s->step);
                    plug_log(s->plug, PLUGLOG_CONNECT_FAILED,
                             &thisaddr, s->port, errmsg, err);

                    while (err && s->addr && sk_nextaddr(s->addr, &s->step)) {
                        err = try_connect(s);
                    }
                    if (err) {
                        plug_closing_errno(s->plug, err);
                        return;      /* socket is now presumably defunct */
                    }
                    if (!s->connected)
                        return;      /* another async attempt in progress */
                } else {
                    /*
                     * The connection attempt succeeded.
                     */
                    SockAddr thisaddr = sk_extractaddr_tmp(s->addr, &s->step);
                    plug_log(s->plug, PLUGLOG_CONNECT_SUCCESS,
                             &thisaddr, s->port, NULL, 0);
                }
            }

            /*
             * If we get here, we've managed to make a connection.
             */
            if (s->addr) {
                sk_addr_free(s->addr);
                s->addr = NULL;
            }
            s->connected = true;
            s->writable = true;
            uxsel_tell(s);
        } else {
            size_t bufsize_before, bufsize_after;
            s->writable = true;
            bufsize_before = s->sending_oob + bufchain_size(&s->output_data);
            try_send(s);
            bufsize_after = s->sending_oob + bufchain_size(&s->output_data);
            if (bufsize_after < bufsize_before)
                plug_sent(s->plug, bufsize_after);
        }
        break;
    }
}